

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

Of_Man_t * Of_StoCreate(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  int *piVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Of_Man_t *p;
  abctime aVar4;
  Of_Obj_t *pOVar5;
  word *pEntry;
  Vec_Mem_t *p_00;
  
  if (0x1e < pPars->nCutNum - 2U) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= OF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                  ,0xd3,"Of_Man_t *Of_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (4 < pPars->nLutSize - 2U) {
    __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= OF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                  ,0xd4,"Of_Man_t *Of_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Vec_IntFreeP(&pGia->vCellMapping);
  if (pGia->pSibls != (int *)0x0) {
    Gia_ManSetPhase(pGia);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  pVVar3 = Vec_IntAlloc(0);
  Mf_ManSetFlowRefs(pGia,pVVar3);
  piVar1 = pVVar3->pArray;
  pVVar3->nCap = 0;
  pVVar3->nSize = 0;
  pVVar3->pArray = (int *)0x0;
  pGia->pRefs = piVar1;
  Vec_IntFree(pVVar3);
  p = (Of_Man_t *)calloc(1,0xb0);
  aVar4 = Abc_Clock();
  p->clkStart = aVar4;
  p->pGia = pGia;
  p->pPars = pPars;
  pOVar5 = (Of_Obj_t *)calloc((long)pGia->nObjs,0x20);
  p->pObjs = pOVar5;
  p->iCur = 2;
  Vec_PtrGrow(&p->vPages,0x100);
  Vec_IntFill(&p->vCutSets,pGia->nObjs,0);
  Vec_IntFill(&p->vCutFlows,pGia->nObjs,0);
  Vec_IntFill(&p->vCutDelays,pGia->nObjs,0);
  Vec_IntGrow(&p->vCutRefs,1000);
  if (pPars->fCutMin != 0) {
    pEntry = (word *)malloc(8);
    p_00 = (Vec_Mem_t *)calloc(1,0x30);
    p_00->nEntrySize = 1;
    p_00->LogPageSze = 0xc;
    p_00->PageMask = 0xfff;
    p_00->iPage = -1;
    iVar2 = Abc_PrimeCudd(10000);
    pVVar3 = Vec_IntStartFull(iVar2);
    p_00->vTable = pVVar3;
    pVVar3 = Vec_IntAlloc(10000);
    p_00->vNexts = pVVar3;
    *pEntry = 0;
    iVar2 = Vec_MemHashInsert(p_00,pEntry);
    if (iVar2 != 0) {
      __assert_fail("Value == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecMem.h"
                    ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    *pEntry = 0xaaaaaaaaaaaaaaaa;
    iVar2 = Vec_MemHashInsert(p_00,pEntry);
    if (iVar2 != 1) {
      __assert_fail("Value == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecMem.h"
                    ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    free(pEntry);
    p->vTtMem = p_00;
  }
  piVar1 = pGia->pRefs;
  pGia->pRefs = (int *)0x0;
  Of_ManAreaFlow(p);
  pGia->pRefs = piVar1;
  return p;
}

Assistant:

Of_Man_t * Of_StoCreate( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    extern void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs );
    Of_Man_t * p;
    Vec_Int_t * vFlowRefs;
    int * pRefs = NULL;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= OF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= OF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vCellMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    // create references
    ABC_FREE( pGia->pRefs );
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    pGia->pRefs= Vec_IntReleaseArray(vFlowRefs);
    Vec_IntFree(vFlowRefs);
    // create
    p = ABC_CALLOC( Of_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pPars    = pPars;
    p->pObjs    = ABC_CALLOC( Of_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur     = 2;
    // other
    Vec_PtrGrow( &p->vPages, 256 );                                    // cut memory
    Vec_IntFill( &p->vCutSets,  Gia_ManObjNum(pGia), 0 );              // cut offsets
    Vec_IntFill( &p->vCutFlows, Gia_ManObjNum(pGia), 0 );              // cut area
    Vec_IntFill( &p->vCutDelays,Gia_ManObjNum(pGia), 0 );              // cut delay
    Vec_IntGrow( &p->vCutRefs,  1000 );                                // cut references
    if ( pPars->fCutMin )
        p->vTtMem = Vec_MemAllocForTT( 6, 0 );          
    // compute area flow
    pRefs = pGia->pRefs; pGia->pRefs = NULL;
    Of_ManAreaFlow( p );
    pGia->pRefs = pRefs;
    return p;
}